

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

tokenStream * lexer::parsefile(string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  tokenStream *ptVar2;
  string current_value;
  string line;
  tokenizer tokenizer;
  ifstream fileStream;
  string local_558;
  undefined1 *local_538;
  undefined8 local_530;
  undefined1 local_528;
  undefined7 uStack_527;
  undefined1 *local_518;
  undefined8 local_510;
  undefined1 local_508;
  undefined7 uStack_507;
  tokenizer local_4f8;
  undefined1 local_228 [520];
  
  std::ifstream::ifstream(local_228);
  local_510 = 0;
  local_508 = 0;
  local_530 = 0;
  local_528 = 0;
  local_538 = &local_528;
  local_518 = &local_508;
  ::tokenizer::tokenizer(&local_4f8);
  local_558._M_dataplus._M_p = (filename->_M_dataplus)._M_p;
  paVar1 = &filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p == paVar1) {
    local_558.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_558.field_2._8_8_ = *(undefined8 *)((long)&filename->field_2 + 8);
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  }
  else {
    local_558.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_558._M_string_length = filename->_M_string_length;
  (filename->_M_dataplus)._M_p = (pointer)paVar1;
  filename->_M_string_length = 0;
  (filename->field_2)._M_local_buf[0] = '\0';
  ::tokenizer::process_file(&local_4f8,&local_558);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  ptVar2 = ::tokenizer::get_token_stream(&local_4f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>_>
  ::~_Rb_tree(&local_4f8.symbol_to_type._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Token_Type>_>_>
  ::~_Rb_tree(&local_4f8.keyword_to_token_type._M_t);
  std::ifstream::~ifstream(&local_4f8.current_stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.current_stream_name._M_dataplus._M_p != &local_4f8.current_stream_name.field_2) {
    operator_delete(local_4f8.current_stream_name._M_dataplus._M_p,
                    local_4f8.current_stream_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.current_word._M_dataplus._M_p != &local_4f8.current_word.field_2) {
    operator_delete(local_4f8.current_word._M_dataplus._M_p,
                    local_4f8.current_word.field_2._M_allocated_capacity + 1);
  }
  if (local_538 != &local_528) {
    operator_delete(local_538,CONCAT71(uStack_527,local_528) + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,CONCAT71(uStack_507,local_508) + 1);
  }
  std::ifstream::~ifstream(local_228);
  return ptVar2;
}

Assistant:

tokenStream *lexer::parsefile(string filename){
    ifstream fileStream;

    string line;

    string current_value;

    tokenizer tokenizer;

    tokenizer.process_file(std::move(filename));

    return tokenizer.get_token_stream();
}